

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_device_uninit__alsa(ma_device *pDevice)

{
  ma_device *pDevice_local;
  
  if (pDevice != (ma_device *)0x0) {
    if ((pDevice->field_24).alsa.pPCMCapture != (ma_ptr)0x0) {
      (*(pDevice->pContext->field_14).alsa.snd_pcm_close)((pDevice->field_24).alsa.pPCMCapture);
      close((pDevice->field_24).alsa.wakeupfdCapture);
      ma_free((pDevice->field_24).alsa.pPollDescriptorsCapture,
              &pDevice->pContext->allocationCallbacks);
    }
    if ((pDevice->field_24).alsa.pPCMPlayback != (ma_ptr)0x0) {
      (*(pDevice->pContext->field_14).alsa.snd_pcm_close)((pDevice->field_24).alsa.pPCMPlayback);
      close((pDevice->field_24).alsa.wakeupfdPlayback);
      ma_free((pDevice->field_24).alsa.pPollDescriptorsPlayback,
              &pDevice->pContext->allocationCallbacks);
    }
    return MA_SUCCESS;
  }
  __assert_fail("pDevice != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x3c3d,"ma_result ma_device_uninit__alsa(ma_device *)");
}

Assistant:

static ma_result ma_device_uninit__alsa(ma_device* pDevice)
{
    MA_ASSERT(pDevice != NULL);

    if ((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture) {
        ((ma_snd_pcm_close_proc)pDevice->pContext->alsa.snd_pcm_close)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture);
        close(pDevice->alsa.wakeupfdCapture);
        ma_free(pDevice->alsa.pPollDescriptorsCapture, &pDevice->pContext->allocationCallbacks);
    }

    if ((ma_snd_pcm_t*)pDevice->alsa.pPCMPlayback) {
        ((ma_snd_pcm_close_proc)pDevice->pContext->alsa.snd_pcm_close)((ma_snd_pcm_t*)pDevice->alsa.pPCMPlayback);
        close(pDevice->alsa.wakeupfdPlayback);
        ma_free(pDevice->alsa.pPollDescriptorsPlayback, &pDevice->pContext->allocationCallbacks);
    }

    return MA_SUCCESS;
}